

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O3

void __thiscall OpenMD::PotVecAccumulator::clear(PotVecAccumulator *this)

{
  (this->super_BaseAccumulator).Count_ = 0;
  memset(&this->Val_,0,0xf0);
  return;
}

Assistant:

void clear() {
      Count_ = 0;
      const Vector<RealType, N_INTERACTION_FAMILIES> potVecZero(0.0);
      Avg_     = potVecZero;
      Avg2_    = potVecZero;
      Val_     = potVecZero;
      Total_   = potVecZero;
      AvgLen_  = 0;
      AvgLen2_ = 0;
    }